

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 VmExecIncludedFile(jx9_context *pCtx,SyString *pPath,int IncludeOnce)

{
  jx9_vm *pVm_00;
  void *pHandle_00;
  undefined1 local_78 [8];
  SyString sScript;
  int isNew;
  jx9_vm *pVm;
  void *pHandle;
  SyBlob sContents;
  jx9_io_stream *pStream;
  sxi32 rc;
  int IncludeOnce_local;
  SyString *pPath_local;
  jx9_context *pCtx_local;
  
  pVm_00 = pCtx->pVm;
  SyBlobInit((SyBlob *)&pHandle,&pVm_00->sAllocator);
  sScript._12_4_ = 0;
  sContents._24_8_ = jx9VmGetStreamDevice(pVm_00,&pPath->zString,pPath->nByte);
  pHandle_00 = jx9StreamOpenHandle(pVm_00,(jx9_io_stream *)sContents._24_8_,pPath->zString,1,1,
                                   (jx9_value *)0x0,1,(int *)&sScript.field_0xc);
  if (pHandle_00 == (void *)0x0) {
    pCtx_local._4_4_ = -2;
  }
  else {
    if ((IncludeOnce == 0) || (sScript._12_4_ != 0)) {
      pStream._0_4_ =
           jx9StreamReadWholeFile(pHandle_00,(jx9_io_stream *)sContents._24_8_,(SyBlob *)&pHandle);
      if ((sxi32)pStream == 0) {
        local_78 = (undefined1  [8])sContents.pAllocator;
        sScript.zString._0_4_ = sContents.pBlob._0_4_;
        VmEvalChunk(pCtx->pVm,pCtx,(SyString *)local_78,0,1);
      }
    }
    else {
      pStream._0_4_ = -0xb;
    }
    SySetPop(&pVm_00->aFiles);
    jx9StreamCloseHandle((jx9_io_stream *)sContents._24_8_,pHandle_00);
    SyBlobRelease((SyBlob *)&pHandle);
    pCtx_local._4_4_ = (sxi32)pStream;
  }
  return pCtx_local._4_4_;
}

Assistant:

static sxi32 VmExecIncludedFile(
	 jx9_context *pCtx, /* Call Context */
	 SyString *pPath,   /* Script path or URL*/
	 int IncludeOnce    /* TRUE if called from import() or require_once() */
	 )
{
	sxi32 rc;
#ifndef JX9_DISABLE_BUILTIN_FUNC
	const jx9_io_stream *pStream;
	SyBlob sContents;
	void *pHandle;
	jx9_vm *pVm;
	int isNew;
	/* Initialize fields */
	pVm = pCtx->pVm;
	SyBlobInit(&sContents, &pVm->sAllocator);
	isNew = 0;
	/* Extract the associated stream */
	pStream = jx9VmGetStreamDevice(pVm, &pPath->zString, pPath->nByte);
	/*
	 * Open the file or the URL [i.e: http://jx9.symisc.net/example/hello.jx9.txt"] 
	 * in a read-only mode.
	 */
	pHandle = jx9StreamOpenHandle(pVm, pStream,pPath->zString, JX9_IO_OPEN_RDONLY, TRUE, 0, TRUE, &isNew);
	if( pHandle == 0 ){
		return SXERR_IO;
	}
	rc = SXRET_OK; /* Stupid cc warning */
	if( IncludeOnce && !isNew ){
		/* Already included */
		rc = SXERR_EXISTS;
	}else{
		/* Read the whole file contents */
		rc = jx9StreamReadWholeFile(pHandle, pStream, &sContents);
		if( rc == SXRET_OK ){
			SyString sScript;
			/* Compile and execute the script */
			SyStringInitFromBuf(&sScript, SyBlobData(&sContents), SyBlobLength(&sContents));
			VmEvalChunk(pCtx->pVm, &(*pCtx), &sScript, 0, TRUE);
		}
	}
	/* Pop from the set of included file */
	(void)SySetPop(&pVm->aFiles);
	/* Close the handle */
	jx9StreamCloseHandle(pStream, pHandle);
	/* Release the working buffer */
	SyBlobRelease(&sContents);
#else
	pCtx = 0; /* cc warning */
	pPath = 0;
	IncludeOnce = 0;
	rc = SXERR_IO;
#endif /* JX9_DISABLE_BUILTIN_FUNC */
	return rc;
}